

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::CompositeVisitor::update(CompositeVisitor *this)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (this->visitorList).
                super__List_base<std::pair<OpenMD::BaseVisitor_*,_int>,_std::allocator<std::pair<OpenMD::BaseVisitor_*,_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      (p_Var1 != (_List_node_base *)&this->visitorList &&
      (p_Var1[1]._M_next != (_List_node_base *)0x0)); p_Var1 = p_Var1->_M_next) {
    (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x48))();
  }
  return;
}

Assistant:

void CompositeVisitor::update() {
    VisitorIterator i;
    BaseVisitor* curVisitor;

    for (curVisitor = beginVisitor(i); curVisitor; curVisitor = nextVisitor(i))
      curVisitor->update();
  }